

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KBO.cpp
# Opt level: O0

void __thiscall
Kernel::KBO::KBO(KBO *this,KboWeightMap<Kernel::FuncSigTraits> *funcWeights,DArray<int> *funcPrec,
                DArray<int> *typeConPrec,DArray<int> *predPrec,DArray<int> *predLevels,
                bool reverseLCM,bool qkbo)

{
  DArray<int> *in_RCX;
  DArray<int> *in_RDX;
  DArray<int> *in_RSI;
  DArray<int> *in_RDI;
  undefined8 in_R8;
  uint uVar1;
  PrecedenceOrdering *unaff_retaddr;
  byte in_stack_00000010;
  _func_void_UserErrorException *in_stack_000001b8;
  KBO *in_stack_000001c0;
  undefined4 in_stack_ffffffffffffff6c;
  KboWeightMap<Kernel::FuncSigTraits> *in_stack_ffffffffffffff70;
  DArray<int> *this_00;
  
  uVar1 = (uint)(in_stack_00000010 & 1);
  PrecedenceOrdering::PrecedenceOrdering
            (unaff_retaddr,in_RDI,in_RSI,in_RDX,in_RCX,SUB81((ulong)in_R8 >> 0x38,0),
             SUB81((ulong)in_R8 >> 0x30,0));
  in_RDI->_size = (size_t)&PTR__KBO_0131ed20;
  KboWeightMap<Kernel::FuncSigTraits>::KboWeightMap
            (in_stack_ffffffffffffff70,
             (KboWeightMap<Kernel::FuncSigTraits> *)CONCAT44(in_stack_ffffffffffffff6c,uVar1));
  this_00 = in_RDI + 7;
  ::operator_new(0x40);
  State::State((State *)0x886523);
  std::unique_ptr<Kernel::KBO::State,std::default_delete<Kernel::KBO::State>>::
  unique_ptr<std::default_delete<Kernel::KBO::State>,void>
            ((unique_ptr<Kernel::KBO::State,_std::default_delete<Kernel::KBO::State>_> *)this_00,
             (pointer)CONCAT44(in_stack_ffffffffffffff6c,uVar1));
  checkAdmissibility<void(*)(Lib::UserErrorException)>(in_stack_000001c0,in_stack_000001b8);
  return;
}

Assistant:

KBO::KBO(
    // KBO params
    KboWeightMap<FuncSigTraits> funcWeights, 
#if __KBO__CUSTOM_PREDICATE_WEIGHTS__
    KboWeightMap<PredSigTraits> predWeights, 
#endif

    // precedence ordering params
    DArray<int> funcPrec,
    DArray<int> typeConPrec,     
    DArray<int> predPrec, 
    DArray<int> predLevels, 

    // other
    bool reverseLCM,
    bool qkbo
  ) : PrecedenceOrdering(funcPrec, typeConPrec, predPrec, predLevels, reverseLCM, qkbo)
  , _funcWeights(funcWeights)
#if __KBO__CUSTOM_PREDICATE_WEIGHTS__
  , _predWeights(predWeights)
#endif
  , _state(new State())
{ 
  checkAdmissibility(throwError);
}